

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O0

ostream * toml::operator<<(ostream *os,basic_value<toml::type_config> *v)

{
  spec s;
  undefined8 in_RSI;
  ostream *in_RDI;
  undefined8 unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_40;
  string local_30 [8];
  basic_value<toml::type_config> *in_stack_ffffffffffffffd8;
  ostream *poVar1;
  
  poVar1 = in_RDI;
  spec::default_version();
  s._8_8_ = poVar1;
  s.version.major = (int)in_RSI;
  s.version.minor = (int)((ulong)in_RSI >> 0x20);
  s._16_8_ = unaff_retaddr;
  format<toml::type_config>(in_stack_ffffffffffffffd8,s);
  std::operator<<(in_RDI,local_30);
  std::__cxx11::string::~string(pbStack_40);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const basic_value<TC>& v)
{
    os << format(v);
    return os;
}